

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O1

int CfdGetSchnorrPubkeyFromPrivkey(void *handle,char *privkey,char **pubkey,bool *parity)

{
  bool bVar1;
  char *pcVar2;
  CfdException *pCVar3;
  Privkey privkey_obj;
  SchnorrPubkey schnorr_pubkey;
  undefined1 local_88 [32];
  string local_68;
  SchnorrPubkey local_48;
  
  cfd::Initialize();
  if (pubkey == (char **)0x0) {
    local_88._0_8_ = "cfdcapi_key.cpp";
    local_88._8_4_ = 0x1a0;
    local_88._16_8_ = "CfdGetSchnorrPubkeyFromPrivkey";
    cfd::core::logger::log<>((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"pubkey is null.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    local_88._0_8_ = local_88 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_88,"Failed to parameter. pubkey is null.","");
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_88);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(privkey);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&local_68,privkey,(allocator *)&local_48);
    cfd::core::Privkey::Privkey((Privkey *)local_88,&local_68,kMainnet,true);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    cfd::core::SchnorrPubkey::FromPrivkey(&local_48,(Privkey *)local_88,parity);
    cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_68,&local_48);
    pcVar2 = cfd::capi::CreateString(&local_68);
    *pubkey = pcVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if (local_48.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer)local_88._0_8_ != (pointer)0x0) {
      operator_delete((void *)local_88._0_8_);
    }
    return 0;
  }
  local_88._0_8_ = "cfdcapi_key.cpp";
  local_88._8_4_ = 0x1a6;
  local_88._16_8_ = "CfdGetSchnorrPubkeyFromPrivkey";
  cfd::core::logger::log<>
            ((CfdSourceLocation *)local_88,kCfdLogLevelWarning,"privkey is null or empty.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  local_88._0_8_ = local_88 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_88,"Failed to parameter. privkey is null or empty.","");
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_88);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetSchnorrPubkeyFromPrivkey(
    void* handle, const char* privkey, char** pubkey, bool* parity) {
  try {
    cfd::Initialize();
    if (pubkey == nullptr) {
      warn(CFD_LOG_SOURCE, "pubkey is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null.");
    }
    if (IsEmptyString(privkey)) {
      warn(CFD_LOG_SOURCE, "privkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. privkey is null or empty.");
    }

    Privkey privkey_obj = Privkey(std::string(privkey));
    SchnorrPubkey schnorr_pubkey =
        SchnorrPubkey::FromPrivkey(privkey_obj, parity);
    *pubkey = CreateString(schnorr_pubkey.GetHex());

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}